

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_verify_tally
              (secp256k1_context *ctx,secp256k1_pedersen_commitment **commits,size_t pcnt,
              secp256k1_pedersen_commitment **ncommits,size_t ncnt)

{
  ulong local_118;
  size_t i;
  secp256k1_ge add;
  secp256k1_gej accj;
  size_t ncnt_local;
  secp256k1_pedersen_commitment **ncommits_local;
  size_t pcnt_local;
  secp256k1_pedersen_commitment **commits_local;
  secp256k1_context *ctx_local;
  
  if (pcnt == 0 || commits != (secp256k1_pedersen_commitment **)0x0) {
    if (ncnt == 0 || ncommits != (secp256k1_pedersen_commitment **)0x0) {
      secp256k1_gej_set_infinity((secp256k1_gej *)&add.infinity);
      for (local_118 = 0; local_118 < ncnt; local_118 = local_118 + 1) {
        secp256k1_pedersen_commitment_load((secp256k1_ge *)&i,ncommits[local_118]);
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)&add.infinity,(secp256k1_gej *)&add.infinity,(secp256k1_ge *)&i,
                   (secp256k1_fe *)0x0);
      }
      secp256k1_gej_neg((secp256k1_gej *)&add.infinity,(secp256k1_gej *)&add.infinity);
      for (local_118 = 0; local_118 < pcnt; local_118 = local_118 + 1) {
        secp256k1_pedersen_commitment_load((secp256k1_ge *)&i,commits[local_118]);
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)&add.infinity,(secp256k1_gej *)&add.infinity,(secp256k1_ge *)&i,
                   (secp256k1_fe *)0x0);
      }
      ctx_local._4_4_ = secp256k1_gej_is_infinity((secp256k1_gej *)&add.infinity);
    }
    else {
      secp256k1_callback_call(&ctx->illegal_callback,"!ncnt || (ncommits != NULL)");
      ctx_local._4_4_ = 0;
    }
  }
  else {
    secp256k1_callback_call(&ctx->illegal_callback,"!pcnt || (commits != NULL)");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_pedersen_verify_tally(const secp256k1_context* ctx, const secp256k1_pedersen_commitment * const* commits, size_t pcnt, const secp256k1_pedersen_commitment * const* ncommits, size_t ncnt) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!pcnt || (commits != NULL));
    ARG_CHECK(!ncnt || (ncommits != NULL));
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < ncnt; i++) {
        secp256k1_pedersen_commitment_load(&add, ncommits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < pcnt; i++) {
        secp256k1_pedersen_commitment_load(&add, commits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    return secp256k1_gej_is_infinity(&accj);
}